

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::FileTypeValid(cmELFInternalImpl<cmELFTypes32> *this,ELF_Half et)

{
  uint eti;
  ELF_Half et_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  if ((((et == 0) || (et == 1)) || (et == 2)) || ((et == 3 || (et == 4)))) {
    this_local._7_1_ = true;
  }
  else if ((et < 0xfe00) || (0xfeff < et)) {
    if (et < 0xff00) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FileTypeValid(ELF_Half et)
  {
    unsigned int eti = static_cast<unsigned int>(et);
    if (eti == ET_NONE || eti == ET_REL || eti == ET_EXEC || eti == ET_DYN ||
        eti == ET_CORE) {
      return true;
    }
#if defined(ET_LOOS) && defined(ET_HIOS)
    if (eti >= ET_LOOS && eti <= ET_HIOS) {
      return true;
    }
#endif
#if defined(ET_LOPROC) && defined(ET_HIPROC)
    if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
      return true;
    }
#endif
    return false;
  }